

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlackCard.cpp
# Opt level: O3

void __thiscall BlackCard::PrintCardStats(BlackCard *this)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  string *psVar5;
  string *psVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  Type *pTVar10;
  
  if (this->type != HOLDING) {
    if (this->type != PERSONALITY) {
      exit(-1);
    }
    Personality::PrintPersonality((Personality *)this);
    return;
  }
  plVar8 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)this[1].super_Card._vptr_Card,
                      (long)this[1].super_Card.name._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
  iVar2 = (*(this->super_Card)._vptr_Card[4])(this);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Holding Type: ",0xe);
  switch(*(undefined4 *)((long)&this[1].super_Card.name.field_2 + 8)) {
  case 1:
    pcVar9 = "Plain";
    goto LAB_0010c711;
  case 2:
    pcVar9 = "Mine";
    lVar7 = 4;
    break;
  case 3:
    pcVar9 = "Gold Mine";
    lVar7 = 9;
    break;
  case 4:
    pcVar9 = "Crystal Mine";
    lVar7 = 0xc;
    break;
  case 5:
    pcVar9 = "Farms";
LAB_0010c711:
    lVar7 = 5;
    break;
  case 6:
    pcVar9 = "Gifts and Favour";
    lVar7 = 0x10;
    break;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if ((char)this[1].super_Card.cost == '\x01') {
    pcVar9 = "Tapped: yes";
    lVar7 = 0xb;
  }
  else {
    pcVar9 = "Tapped: no";
    lVar7 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (*(char *)((long)&this[1].super_Card.cost + 1) == '\x01') {
    pcVar9 = "Revealed: yes";
    lVar7 = 0xd;
  }
  else {
    pcVar9 = "Revealed: no";
    lVar7 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Harvest Value: ",0xf);
  iVar2 = (*(this->super_Card)._vptr_Card[7])(this);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  lVar7 = *(long *)&this[1].super_Card.type;
  pcVar1 = this[1].name._M_dataplus._M_p;
  if (lVar7 == 0 && pcVar1 == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Holding is not in a chain",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    plVar8 = (long *)std::ostream::flush();
  }
  else {
    psVar5 = &this[1].name;
    if (lVar7 == 0) {
      if (*(long *)(pcVar1 + 0xa0) == 0) {
        plVar4 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding connected with the subHolding ",0x26);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
        psVar6 = getName_abi_cxx11_((BlackCard *)(psVar5->_M_dataplus)._M_p);
        plVar4 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar6->_M_dataplus)._M_p,
                                    psVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar4,"and ",4);
        psVar5 = (string *)((psVar5->_M_dataplus)._M_p + 0xa0);
      }
    }
    else {
      pTVar10 = &this[1].super_Card.type;
      if (pcVar1 == (pointer)0x0) {
        if (*(long *)(lVar7 + 0x98) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Holding connected with the upperholding ",0x28);
          plVar4 = &std::cout;
          psVar5 = (string *)pTVar10;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
          psVar5 = getName_abi_cxx11_(*(BlackCard **)pTVar10);
          plVar4 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(psVar5->_M_dataplus)._M_p,
                                      psVar5->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar4,"and ",4);
          psVar5 = (string *)(*(long *)pTVar10 + 0x98);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
        psVar5 = getName_abi_cxx11_((BlackCard *)(psVar5->_M_dataplus)._M_p);
        plVar4 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar5->_M_dataplus)._M_p,
                                    psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar4,"and ",4);
        psVar5 = (string *)pTVar10;
      }
    }
    psVar5 = getName_abi_cxx11_((BlackCard *)(psVar5->_M_dataplus)._M_p);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)plVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  return;
}

Assistant:

void BlackCard::PrintCardStats()                                //defines type of card and calls proper print function for that type
{
    if (type == PERSONALITY)
    {
        Personality* pers = reinterpret_cast<Personality*>(this);
        pers->PrintPersonality();

        pers = nullptr;
        delete pers;
    }
    else if (type == HOLDING)
    {
        Holding * hold = reinterpret_cast<Holding*>(this);
        hold->PrintHolding();

        hold = nullptr;
        delete hold;
    }
    else
        exit(-1);
}